

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O3

void __thiscall KDIS::UTILS::DIS_Logger_Playback::loadFromFile(DIS_Logger_Playback *this)

{
  pointer pcVar1;
  long lVar2;
  _Map_pointer ppLVar3;
  char cVar4;
  KException *this_00;
  Log l;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"loadFromFile","");
    KException::KException(this_00,(KString *)local_70,6);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pcVar1 = local_70 + 0x10;
  local_70._8_8_ = 0;
  local_70[0x10] = '\0';
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  lVar2 = *(long *)(*(long *)this + -0x18);
  local_70._0_8_ = pcVar1;
  local_50._M_p = (pointer)&local_40;
  if (((&this->field_0x20)[lVar2] & 2) == 0) {
    do {
      cVar4 = std::ios::widen((char)lVar2 + (char)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)local_70,cVar4);
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)&local_50,cVar4);
      std::
      deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
      ::push_back(&(this->m_qLog).c,(value_type *)local_70);
      if (((ulong)this->m_ui16PreLoadLines != 0) &&
         (ppLVar3 = (this->m_qLog).c.
                    super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,
         ((long)(this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)(this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
         ((long)(this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)(this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
         ((long)ppLVar3 +
          ((ulong)(ppLVar3 != (_Map_pointer)0x0) * -8 -
          (long)(this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8) <=
         (ulong)this->m_ui16PreLoadLines)) break;
      lVar2 = *(long *)(*(long *)this + -0x18);
    } while (((&this->field_0x20)[lVar2] & 2) == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
  }
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
  }
  return;
}

Assistant:

void DIS_Logger_Playback::loadFromFile() noexcept(false)
{
    if( m_File.is_open() == false )throw KException( __FUNCTION__, FILE_NOT_OPEN );

    Log l;

    while( m_File.eof() == false )
    {
        getline( m_File, l.sStamp );
        getline( m_File, l.sData );

        m_qLog.push( l );

        if( m_ui16PreLoadLines != 0 )
        {
            if( m_ui16PreLoadLines >= m_qLog.size() )break;
        }
    }
}